

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O1

CScript * BuildScript<opcodetype,int,opcodetype,opcodetype,std::vector<unsigned_char,std::allocator<unsigned_char>>const&,opcodetype>
                    (CScript *__return_storage_ptr__,opcodetype *inputs,int *inputs_1,
                    opcodetype *inputs_2,opcodetype *inputs_3,
                    vector<unsigned_char,_std::allocator<unsigned_char>_> *inputs_4,
                    opcodetype *inputs_5)

{
  long lVar1;
  pointer pbVar2;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x10) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x18) = 0;
  (__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 8) = 0;
  CScript::operator<<(__return_storage_ptr__,*inputs);
  CScript::push_int64(__return_storage_ptr__,(long)*inputs_1);
  CScript::operator<<(__return_storage_ptr__,*inputs_2);
  CScript::operator<<(__return_storage_ptr__,*inputs_3);
  pbVar2 = (inputs_4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  b._M_extent._M_extent_value =
       (long)(inputs_4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish - (long)pbVar2;
  b._M_ptr = pbVar2;
  CScript::operator<<(__return_storage_ptr__,b);
  CScript::operator<<(__return_storage_ptr__,*inputs_5);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CScript BuildScript(Ts&&... inputs)
{
    CScript ret;
    int cnt{0};

    ([&ret, &cnt] (Ts&& input) {
        if constexpr (std::is_same_v<std::remove_cv_t<std::remove_reference_t<Ts>>, CScript>) {
            // If it is a CScript, extend ret with it. Move or copy the first element instead.
            if (cnt == 0) {
                ret = std::forward<Ts>(input);
            } else {
                ret.insert(ret.end(), input.begin(), input.end());
            }
        } else {
            // Otherwise invoke CScript::operator<<.
            ret << input;
        }
        cnt++;
    } (std::forward<Ts>(inputs)), ...);

    return ret;
}